

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall libtorrent::aux::session_impl::sent_syn(session_impl *this,bool ipv6)

{
  undefined1 *puVar1;
  int64_t value;
  undefined7 in_register_00000031;
  long lVar2;
  bool bVar3;
  
  bVar3 = (int)CONCAT71(in_register_00000031,ipv6) != 0;
  value = 0x28;
  if (bVar3) {
    value = 0x3c;
  }
  lVar2 = 0x28;
  if (bVar3) {
    lVar2 = 0x3c;
  }
  counters::inc_stats_counter(&this->m_stats_counters,0x81,value);
  puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x48;
  *(int *)puVar1 = *(int *)puVar1 + (int)lVar2;
  puVar1 = &(this->m_stat).m_stat.super_array<libtorrent::aux::stat_channel,_6UL>.field_0x40;
  *(long *)puVar1 = *(long *)puVar1 + lVar2;
  return;
}

Assistant:

void session_impl::sent_syn(bool ipv6)
	{
		int const overhead = ipv6 ? 60 : 40;
		m_stats_counters.inc_stats_counter(counters::sent_ip_overhead_bytes
			, overhead);

		m_stat.sent_syn(ipv6);
	}